

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Global_get(w3Interp *this)

{
  pointer pGVar1;
  pointer pwVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  w3Interp *pwVar4;
  w3Stack *unaff_R15;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  pointer pwStack_28;
  w3Module *local_20;
  
  pwVar4 = (w3Interp *)local_48;
  uVar3 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  if (uVar3 < (ulong)((long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5)) {
    unaff_R15 = &this->super_w3Stack;
    pwVar2 = (this->module_instance->globals).
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    aStack_38._M_allocated_capacity = (size_type)pwVar2[uVar3].value.value;
    local_48[0] = Tag_Value;
    aStack_38._8_8_ = (w3Frame *)0x0;
    pwStack_28 = (pointer)0x0;
    local_20 = (w3Module *)0x0;
    local_48._9_7_ = 0;
    local_48[8] = pwVar2[uVar3].value.tag;
    w3Stack::push_value(unaff_R15,(w3StackValue *)local_48);
    w3Stack::AssertTopIsValue(unaff_R15);
    pGVar1 = (this->module->globals).super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
    uVar3 = uVar3 * 0x20;
    pwVar4 = this;
    if ((this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
        super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value.tag == (pGVar1->global_type).value_type) {
      return;
    }
  }
  else {
    StringFormat_abi_cxx11_((string *)local_48,"%lX %lX",uVar3);
    AssertFailedFormat("i < module->globals.size ()",(string *)local_48);
  }
  w3Stack::AssertTopIsValue(unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)local_48,"%X %X",
             (ulong)(pwVar4->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                    super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].value.tag,
             (ulong)(&(((pwVar4->module->globals).
                        super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                        super__Vector_impl_data._M_start)->global_type).value_type)[uVar3]);
  AssertFailedFormat("tag () == module->globals [i].global_type.value_type",(string *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._1_7_,local_48[0]) != &aStack_38) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._1_7_,local_48[0]),aStack_38._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Global_get)
{
    const size_t i = instr->u32;
    AssertFormat (i < module->globals.size (), ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, module->globals.size ()));
    push_value (w3StackValue (module_instance->globals [i].value));
    AssertFormat (tag () == module->globals [i].global_type.value_type, ("%X %X", tag (), module->globals [i].global_type.value_type));
}